

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mame_ym2612fm.c
# Opt level: O2

void update_ssg_eg_channel(FM_SLOT *SLOT)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  long lVar4;
  int iVar5;
  
  lVar4 = 0x49;
  do {
    bVar2 = *(byte *)((long)SLOT + lVar4 + -1);
    if ((((bVar2 & 8) != 0) && (iVar5 = *(int *)((long)SLOT + lVar4 + -0x15), 0x1ff < iVar5)) &&
       (bVar3 = *(byte *)((long)SLOT + lVar4 + -0x1d), 1 < bVar3)) {
      if ((bVar2 & 1) == 0) {
        if ((bVar2 & 2) == 0) {
          *(undefined4 *)((long)SLOT + lVar4 + -0x25) = 0;
        }
        else {
          pbVar1 = (byte *)((long)&SLOT->DT + lVar4);
          *pbVar1 = *pbVar1 ^ 4;
        }
        if (bVar3 != 4) {
          if ((uint)*(byte *)((long)SLOT + lVar4 + -0x2d) + *(int *)((long)SLOT + lVar4 + -0x3d) <
              0x5e) {
            *(undefined1 *)((long)SLOT + lVar4 + -0x1d) = 4;
          }
          else {
            *(undefined4 *)((long)SLOT + lVar4 + -0x15) = 0;
            *(byte *)((long)SLOT + lVar4 + -0x1d) = *(int *)((long)SLOT + lVar4 + -0x11) == 0 ^ 3;
            iVar5 = 0;
          }
        }
      }
      else {
        if ((bVar2 & 2) != 0) {
          *(undefined1 *)((long)&SLOT->DT + lVar4) = 4;
        }
        if ((bVar3 != 4) && (*(byte *)((long)&SLOT->DT + lVar4) == (bVar2 & 4))) {
          *(undefined4 *)((long)SLOT + lVar4 + -0x15) = 0x3ff;
          iVar5 = 0x3ff;
        }
      }
      if (*(byte *)((long)&SLOT->DT + lVar4) == (bVar2 & 4)) {
        iVar5 = iVar5 + *(int *)((long)SLOT + lVar4 + -0x19);
      }
      else {
        iVar5 = (0x200U - iVar5 & 0x3ff) + *(int *)((long)SLOT + lVar4 + -0x19);
      }
      *(int *)((long)SLOT + lVar4 + -0xd) = iVar5;
    }
    lVar4 = lVar4 + 0x50;
  } while ((int)lVar4 != 0x189);
  return;
}

Assistant:

INLINE void update_ssg_eg_channel(FM_SLOT *SLOT)
{
	unsigned int i = 4; /* four operators per channel */

	do
	{
		/* detect SSG-EG transition */
		/* this is not required during release phase as the attenuation has been forced to MAX and output invert flag is not used */
		/* if an Attack Phase is programmed, inversion can occur on each sample */
		if ((SLOT->ssg & 0x08) && (SLOT->volume >= 0x200) && (SLOT->state > EG_REL))
		{
			if (SLOT->ssg & 0x01)  /* bit 0 = hold SSG-EG */
			{
				/* set inversion flag */
				if (SLOT->ssg & 0x02)
					SLOT->ssgn = 4;

				/* force attenuation level during decay phases */
				if ((SLOT->state != EG_ATT) && !(SLOT->ssgn ^ (SLOT->ssg & 0x04)))
					SLOT->volume  = MAX_ATT_INDEX;
			}
			else  /* loop SSG-EG */
			{
				/* toggle output inversion flag or reset Phase Generator */
					if (SLOT->ssg & 0x02)
						SLOT->ssgn ^= 4;
					else
						SLOT->phase = 0;

				/* same as Key ON */
				if (SLOT->state != EG_ATT)
				{
					if ((SLOT->ar + SLOT->ksr) < 94 /*32+62*/)
					{
						SLOT->state = (SLOT->volume <= MIN_ATT_INDEX) ? ((SLOT->sl == MIN_ATT_INDEX) ? EG_SUS : EG_DEC) : EG_ATT;
					}
					else
					{
						/* Attack Rate is maximal: directly switch to Decay or Substain */
						SLOT->volume = MIN_ATT_INDEX;
						SLOT->state = (SLOT->sl == MIN_ATT_INDEX) ? EG_SUS : EG_DEC;
					}
				}
			}

			/* recalculate EG output */
			if (SLOT->ssgn ^ (SLOT->ssg&0x04))
				SLOT->vol_out = ((UINT32)(0x200 - SLOT->volume) & MAX_ATT_INDEX) + SLOT->tl;
			else
				SLOT->vol_out = (UINT32)SLOT->volume + SLOT->tl;
		}

		/* next slot */
		SLOT++;
		i--;
	} while (i);
}